

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O2

void __thiscall fp::Algorithm::~Algorithm(Algorithm *this)

{
  std::array<std::array<fp::Node,_16UL>,_16UL>::~array(&this->node_master_);
  std::array<std::array<fp::Node,_16UL>,_16UL>::~array(&this->node_info);
  std::_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~_Deque_base
            ((_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
             &this->path_stack_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~_Deque_base
            ((_Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
             &this->stack_);
  return;
}

Assistant:

~Algorithm() = default;